

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_cpool_xfer_init(Curl_easy *data)

{
  long lVar1;
  cpool *pcVar2;
  cpool *cpool;
  Curl_easy *data_local;
  
  pcVar2 = cpool_get_instance(data);
  if (pcVar2 == (cpool *)0x0) {
    data->id = 0;
    (data->state).lastconnect_id = -1;
  }
  else {
    if (pcVar2 != (cpool *)0x0) {
      if ((pcVar2->share != (Curl_share *)0x0) && ((pcVar2->share->specifier & 0x20) != 0)) {
        Curl_share_lock(pcVar2->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      pcVar2->field_0x98 = pcVar2->field_0x98 & 0xfe | 1;
    }
    lVar1 = pcVar2->next_easy_id;
    pcVar2->next_easy_id = lVar1 + 1;
    data->id = lVar1;
    if (pcVar2->next_easy_id < 1) {
      pcVar2->next_easy_id = 0;
    }
    (data->state).lastconnect_id = -1;
    (pcVar2->idata->set).timeout = (data->set).timeout;
    (pcVar2->idata->set).server_response_timeout = (data->set).server_response_timeout;
    *(ulong *)&(pcVar2->idata->set).field_0x8ca =
         *(ulong *)&(pcVar2->idata->set).field_0x8ca & 0xffffffff7fffffff |
         (ulong)((uint)(*(ulong *)&(data->set).field_0x8ca >> 0x1f) & 1) << 0x1f;
    if (((pcVar2 != (cpool *)0x0) &&
        (pcVar2->field_0x98 = pcVar2->field_0x98 & 0xfe, pcVar2->share != (Curl_share *)0x0)) &&
       ((pcVar2->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(pcVar2->idata,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_cpool_xfer_init(struct Curl_easy *data)
{
  struct cpool *cpool = cpool_get_instance(data);

  DEBUGASSERT(cpool);
  if(cpool) {
    CPOOL_LOCK(cpool);
    /* the identifier inside the connection cache */
    data->id = cpool->next_easy_id++;
    if(cpool->next_easy_id <= 0)
      cpool->next_easy_id = 0;
    data->state.lastconnect_id = -1;

    /* The closure handle only ever has default timeouts set. To improve the
       state somewhat we clone the timeouts from each added handle so that the
       closure handle always has the same timeouts as the most recently added
       easy handle. */
    cpool->idata->set.timeout = data->set.timeout;
    cpool->idata->set.server_response_timeout =
      data->set.server_response_timeout;
    cpool->idata->set.no_signal = data->set.no_signal;

    CPOOL_UNLOCK(cpool);
  }
  else {
    /* We should not get here, but in a non-debug build, do something */
    data->id = 0;
    data->state.lastconnect_id = -1;
  }
}